

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DbFreeNN(sqlite3 *db,void *p)

{
  int *piVar1;
  uint uVar2;
  
  if (db != (sqlite3 *)0x0) {
    if (db->pnBytesFreed != (int *)0x0) {
      if (((db == (sqlite3 *)0x0) || (p < (db->lookaside).pStart)) || ((db->lookaside).pEnd <= p)) {
        uVar2 = (*sqlite3Config.m.xSize)(p);
      }
      else {
        uVar2 = (uint)(db->lookaside).sz;
      }
      *db->pnBytesFreed = *db->pnBytesFreed + uVar2;
      return;
    }
    if (((db->lookaside).pStart <= p) && (p < (db->lookaside).pEnd)) {
      *(LookasideSlot **)p = (db->lookaside).pFree;
      (db->lookaside).pFree = (LookasideSlot *)p;
      piVar1 = &(db->lookaside).nOut;
      *piVar1 = *piVar1 + -1;
      return;
    }
  }
  sqlite3_free(p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DbFreeNN(sqlite3 *db, void *p){
  assert( db==0 || sqlite3_mutex_held(db->mutex) );
  assert( p!=0 );
  if( db ){
    if( db->pnBytesFreed ){
      measureAllocationSize(db, p);
      return;
    }
    if( isLookaside(db, p) ){
      LookasideSlot *pBuf = (LookasideSlot*)p;
#ifdef SQLITE_DEBUG
      /* Trash all content in the buffer being freed */
      memset(p, 0xaa, db->lookaside.sz);
#endif
      pBuf->pNext = db->lookaside.pFree;
      db->lookaside.pFree = pBuf;
      db->lookaside.nOut--;
      return;
    }
  }
  assert( sqlite3MemdebugHasType(p, (MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
  assert( sqlite3MemdebugNoType(p, (u8)~(MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
  assert( db!=0 || sqlite3MemdebugNoType(p, MEMTYPE_LOOKASIDE) );
  sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
  sqlite3_free(p);
}